

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  Mat *this_00;
  size_t _elemsize;
  void *pvVar4;
  pointer pMVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  void *__src;
  int p;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int c;
  size_t i;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  size_t i_1;
  void *pvVar19;
  int j;
  int iVar20;
  long local_d8;
  Mat m;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar13 = this_00->dims;
  _elemsize = this_00->elemsize;
  pvVar4 = (this->slices).data;
  if (uVar13 == 1) {
    iVar2 = this_00->w;
    lVar17 = 0;
    lVar11 = 0;
    uVar15 = 0;
    iVar18 = 0;
    while( true ) {
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar5) / 0x38;
      if (uVar7 <= uVar15) break;
      iVar9 = *(int *)((long)pvVar4 + uVar15 * 4);
      if (iVar9 == -0xe9) {
        iVar9 = (int)((ulong)((long)iVar2 - (long)iVar18) / (uVar7 + lVar17));
      }
      Mat::create((Mat *)((long)&pMVar5->data + lVar11),iVar9,_elemsize,opt->blob_allocator);
      pvVar19 = *(void **)((long)&pMVar5->data + lVar11);
      if ((pvVar19 == (void *)0x0) ||
         ((long)*(int *)((long)&pMVar5->c + lVar11) * *(long *)((long)&pMVar5->cstep + lVar11) == 0)
         ) {
        return -100;
      }
      memcpy(pvVar19,(void *)((long)iVar18 * 4 + (long)this_00->data),(long)iVar9 * _elemsize);
      iVar18 = iVar18 + iVar9;
      uVar15 = uVar15 + 1;
      lVar11 = lVar11 + 0x38;
      lVar17 = lVar17 + -1;
    }
  }
  else {
    uVar3 = this->axis;
    if ((uVar13 ^ 2) == 0 && uVar3 == 0) {
      iVar2 = this_00->w;
      iVar18 = this_00->h;
      lVar11 = 0;
      lVar17 = 0;
      uVar15 = 0;
      iVar9 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x38;
        if (uVar7 <= uVar15) break;
        iVar16 = *(int *)((long)pvVar4 + uVar15 * 4);
        if (iVar16 == -0xe9) {
          iVar16 = (int)((ulong)((long)iVar18 - (long)iVar9) / (uVar7 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar5->data + lVar17),iVar2,iVar16,_elemsize,opt->blob_allocator
                   );
        pvVar19 = *(void **)((long)&pMVar5->data + lVar17);
        if (pvVar19 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar5->c + lVar17) * *(long *)((long)&pMVar5->cstep + lVar17) ==
            0) {
          return -100;
        }
        memcpy(pvVar19,(void *)((long)this_00->w * (long)iVar9 * 4 + (long)this_00->data),
               (long)(iVar16 * iVar2) * _elemsize);
        iVar9 = iVar9 + iVar16;
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0x38;
        lVar11 = lVar11 + -1;
      }
    }
    else if ((uVar13 ^ 2) == 0 && (uVar3 ^ 1) == 0) {
      iVar2 = this_00->w;
      iVar18 = this_00->h;
      iVar9 = 0;
      if (0 < iVar18) {
        iVar9 = iVar18;
      }
      uVar15 = 0;
      iVar16 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x38;
        uVar8 = uVar7 - uVar15;
        if (uVar7 < uVar15 || uVar8 == 0) break;
        iVar12 = *(int *)((long)pvVar4 + uVar15 * 4);
        if (iVar12 == -0xe9) {
          iVar12 = (int)((ulong)((long)iVar2 - (long)iVar16) / uVar8);
        }
        pMVar1 = pMVar5 + uVar15;
        Mat::create(pMVar1,iVar12,iVar18,_elemsize,opt->blob_allocator);
        if (pMVar5[uVar15].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (iVar20 = 0; iVar9 != iVar20; iVar20 = iVar20 + 1) {
          memcpy((void *)((long)pMVar1->w * (long)iVar20 * 4 + (long)pMVar1->data),
                 (void *)((long)this_00->data +
                         (long)iVar16 * 4 + (long)this_00->w * (long)iVar20 * 4),
                 (long)iVar12 * _elemsize);
        }
        iVar16 = iVar12 + iVar16;
        uVar15 = uVar15 + 1;
      }
    }
    else {
      uVar13 = uVar13 ^ 3;
      if (uVar13 == 0 && uVar3 == 0) {
        iVar2 = this_00->w;
        iVar18 = this_00->h;
        iVar9 = this_00->c;
        local_d8 = 0;
        lVar11 = 0;
        uVar15 = 0;
        iVar16 = 0;
        while( true ) {
          pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x38;
          if (uVar7 <= uVar15) break;
          iVar12 = *(int *)((long)pvVar4 + uVar15 * 4);
          if (iVar12 == -0xe9) {
            iVar12 = (int)((ulong)((long)iVar9 - (long)iVar16) / (uVar7 + local_d8));
          }
          pMVar1 = (Mat *)((long)&pMVar5->data + lVar11);
          Mat::create(pMVar1,iVar2,iVar18,iVar12,_elemsize,opt->blob_allocator);
          if (*(long *)((long)&pMVar5->data + lVar11) == 0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar5->c + lVar11) * *(long *)((long)&pMVar5->cstep + lVar11)
              == 0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          Mat::channel(&m,this_00,iVar16);
          pvVar19 = m.data;
          Mat::~Mat(&m);
          memcpy(pMVar1->data,pvVar19,(long)((int)sVar6 * iVar12) * _elemsize);
          iVar16 = iVar12 + iVar16;
          uVar15 = uVar15 + 1;
          lVar11 = lVar11 + 0x38;
          local_d8 = local_d8 + -1;
        }
      }
      else if ((uVar3 ^ 1) == 0 && uVar13 == 0) {
        iVar2 = this_00->w;
        iVar18 = this_00->c;
        iVar9 = this_00->h;
        iVar16 = 0;
        if (0 < iVar18) {
          iVar16 = iVar18;
        }
        iVar12 = 0;
        uVar15 = 0;
        while( true ) {
          pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x38;
          uVar8 = uVar7 - uVar15;
          if (uVar7 < uVar15 || uVar8 == 0) break;
          iVar20 = *(int *)((long)pvVar4 + uVar15 * 4);
          if (iVar20 == -0xe9) {
            iVar20 = (int)((ulong)((long)iVar9 - (long)iVar12) / uVar8);
          }
          pMVar1 = pMVar5 + uVar15;
          Mat::create(pMVar1,iVar2,iVar20,iVar18,_elemsize,opt->blob_allocator);
          if (pMVar5[uVar15].data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          for (iVar10 = 0; iVar16 != iVar10; iVar10 = iVar10 + 1) {
            Mat::channel(&m,pMVar1,iVar10);
            pvVar19 = m.data;
            Mat::~Mat(&m);
            Mat::channel(&m,this_00,iVar10);
            __src = (void *)((long)m.w * (long)iVar12 * 4 + (long)m.data);
            Mat::~Mat(&m);
            memcpy(pvVar19,__src,(long)(iVar20 * iVar2) * _elemsize);
          }
          iVar12 = iVar20 + iVar12;
          uVar15 = uVar15 + 1;
        }
      }
      else {
        if (uVar13 != 0 || uVar3 != 2) {
          return 0;
        }
        iVar2 = this_00->w;
        iVar18 = this_00->h;
        iVar9 = this_00->c;
        iVar16 = 0;
        if (0 < iVar18) {
          iVar16 = iVar18;
        }
        iVar12 = 0;
        if (0 < iVar9) {
          iVar12 = iVar9;
        }
        iVar20 = 0;
        uVar15 = 0;
        while( true ) {
          pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x38;
          uVar8 = uVar7 - uVar15;
          if (uVar7 < uVar15 || uVar8 == 0) break;
          iVar10 = *(int *)((long)pvVar4 + uVar15 * 4);
          if (iVar10 == -0xe9) {
            iVar10 = (int)((ulong)((long)iVar2 - (long)iVar20) / uVar8);
          }
          pMVar1 = pMVar5 + uVar15;
          Mat::create(pMVar1,iVar10,iVar18,iVar9,_elemsize,opt->blob_allocator);
          if (pMVar5[uVar15].data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          for (c = 0; c != iVar12; c = c + 1) {
            Mat::channel(&m,pMVar1,c);
            pvVar19 = m.data;
            Mat::~Mat(&m);
            Mat::channel(&m,this_00,c);
            for (iVar14 = 0; iVar16 != iVar14; iVar14 = iVar14 + 1) {
              memcpy(pvVar19,(void *)((long)m.data + (long)iVar20 * 4 + (long)iVar14 * (long)m.w * 4
                                     ),_elemsize * (long)iVar10);
              pvVar19 = (void *)((long)pvVar19 + (long)iVar10 * 4);
            }
            Mat::~Mat(&m);
          }
          iVar20 = iVar10 + iVar20;
          uVar15 = uVar15 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const float* ptr = bottom_blob.row(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                float* outptr = top_blob.row(j);
                const float* ptr = bottom_blob.row(j) + q;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = bottom_blob.cstep * slice;

            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                float* outptr = top_blob.channel(p);
                const float* ptr = bottom_blob.channel(p).row(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                float* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const float* ptr = m.row(j) + q;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}